

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O2

_Bool ssh1_check_termination(ssh1_connection_state *s)

{
  int iVar1;
  PktOut *pPVar2;
  
  if (s->session_terminated != true) {
    return false;
  }
  iVar1 = count234(s->channels);
  if (iVar1 == 0) {
    pPVar2 = (*((s->ppl).bpp)->vt->new_pktout)(0x21);
    pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar2->qnode);
    ssh_user_close((s->ppl).ssh,"Session finished");
  }
  return iVar1 == 0;
}

Assistant:

bool ssh1_check_termination(struct ssh1_connection_state *s)
{
    /*
     * Decide whether we should terminate the SSH connection now.
     * Called after a channel goes away, or when the main session
     * returns SSH1_SMSG_EXIT_STATUS; we terminate when none of either
     * is left.
     */
    if (s->session_terminated && count234(s->channels) == 0) {
        PktOut *pktout = ssh_bpp_new_pktout(
            s->ppl.bpp, SSH1_CMSG_EXIT_CONFIRMATION);
        pq_push(s->ppl.out_pq, pktout);

        ssh_user_close(s->ppl.ssh, "Session finished");
        return true;
    }

    return false;
}